

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

type calcGrad(Mesh *mesh,VectorXd *x,double epsilon)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  _Type aiVar12;
  _Type aiVar13;
  _Type aiVar14;
  _Type aiVar15;
  _Type aiVar16;
  _Type aiVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  _Type aiVar23;
  _Type aiVar24;
  double dVar25;
  int iVar26;
  undefined8 *puVar27;
  undefined8 uVar28;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> _Var29;
  value_type f;
  VectorXd *in_RDX;
  ulong uVar30;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  VectorT<double,_3> *__range3;
  int i_2;
  uint uVar31;
  undefined8 *puVar32;
  uint uVar33;
  int i;
  long lVar34;
  long lVar35;
  PolyConnectivity *pPVar36;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  undefined8 in_XMM0_Qb;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined4 uVar49;
  uint uVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  undefined1 auVar67 [16];
  double dVar68;
  _Type aiVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar78;
  type tVar79;
  undefined1 auVar80 [12];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1_1;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  VertexHandle vs [3];
  Vec3d pe2;
  Vec3d pe1;
  Vec3d ue2;
  Vec3d ue1;
  undefined1 local_3b8 [12];
  int iStack_3ac;
  double local_3a8;
  _Type local_398 [2];
  double local_388;
  _Type local_378 [2];
  double local_368;
  container local_358;
  _Type aiStack_350;
  undefined8 local_348;
  PolyConnectivity *local_340;
  EdgeHandle local_338 [2];
  _Type aiStack_330;
  undefined8 local_328;
  _Type local_318 [3];
  uint local_2fc;
  double local_2f8 [4];
  double local_2d8 [4];
  double local_2b8 [4];
  ulong local_298;
  VectorXd *local_290;
  undefined1 local_288 [16];
  double local_278;
  undefined8 uStack_270;
  Mesh *local_260;
  ulong local_258;
  undefined8 local_250;
  int local_248;
  uint local_240;
  uint local_23c;
  _Type local_238 [4];
  _Type local_218 [4];
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  double dStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  double local_188;
  double dStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  double local_158 [4];
  double local_138 [4];
  _Type local_118 [2];
  double local_108;
  _Type local_f8 [2];
  double local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_340 = (PolyConnectivity *)x;
  local_278 = epsilon;
  uStack_270 = in_XMM0_Qb;
  local_260 = mesh;
  initHashMap((Mesh *)x,in_RDX,epsilon);
  uVar30 = (in_RDX->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_290 = in_RDX;
  if (uVar30 == 0) {
    uVar38 = 0;
    uVar37 = 0;
    puVar27 = (undefined8 *)0x0;
  }
  else {
    if (0x1fffffffffffffff < uVar30) {
LAB_0013c9de:
      puVar27 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar27 = std::streambuf::xsgetn;
      __cxa_throw(puVar27,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    puVar27 = (undefined8 *)malloc(uVar30 * 8);
    if (puVar27 == (undefined8 *)0x0) goto LAB_0013c9de;
    if (uVar30 == 1) {
      uVar38 = 0;
      uVar37 = 0;
    }
    else {
      uVar38 = uVar30 & 0x1ffffffffffffffe;
      uVar37 = 2;
      if (2 < uVar38) {
        uVar37 = uVar38;
      }
      memset(puVar27,0,uVar37 * 8);
      uVar37 = uVar30 * 8 & 0xfffffffffffffff0;
    }
  }
  if (uVar38 < uVar30) {
    memset((void *)((long)puVar27 + uVar37),0,uVar30 * 8 - uVar37);
  }
  pPVar36 = local_340;
  local_298 = uVar30;
  local_288 = OpenMesh::PolyConnectivity::faces_begin(local_340);
  auVar80 = OpenMesh::PolyConnectivity::faces_end(pPVar36);
  auVar18 = local_288._0_12_;
  iVar26 = local_288._8_4_;
  uVar28 = local_288._0_8_;
  while (auVar80 != auVar18) {
    local_248 = -1;
    local_250 = 0xffffffffffffffff;
    uVar50 = *(uint *)(*(long *)&pPVar36->field_0xf8 + (long)iVar26 * 4);
    if ((int)uVar50 < 0) {
      local_250._4_4_ = -1;
      local_250._0_4_ = -1;
    }
    else {
      lVar35 = *(long *)&pPVar36->field_0xe0;
      uVar31 = 0;
      puVar32 = &local_250;
      uVar33 = uVar50;
      do {
        do {
          lVar34 = (long)((int)uVar33 >> 1) * 0x20 + lVar35;
          uVar30 = (ulong)((uVar33 & 1) << 4);
          *(undefined4 *)puVar32 = *(undefined4 *)(uVar30 + 4 + lVar34);
          uVar33 = *(uint *)(uVar30 + 8 + lVar34);
          uVar31 = uVar31 + (uVar33 == uVar50);
          puVar32 = (undefined8 *)((long)puVar32 + 4);
        } while (uVar33 != uVar50);
      } while (uVar31 != ~uVar50 >> 0x1f);
    }
    iVar2 = (int)local_250 * 2;
    pdVar4 = (local_290->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    aiVar12 = *(_Type *)(pdVar4 + iVar2);
    aiVar13 = ((_Type *)(pdVar4 + iVar2))[1];
    local_358._M_elems[0] = aiVar12[0];
    local_358._M_elems[1] = aiVar12[1];
    aiStack_350[0] = aiVar13[0];
    aiStack_350[1] = aiVar13[1];
    local_348 = 0;
    iVar3 = local_250._4_4_ * 2;
    aiVar14 = *(_Type *)(pdVar4 + iVar3);
    aiVar15 = ((_Type *)(pdVar4 + iVar3))[1];
    local_338[0].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)aiVar14[0];
    local_338[1].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)aiVar14[1];
    aiStack_330[0] = aiVar15[0];
    aiStack_330[1] = aiVar15[1];
    local_328 = 0;
    uVar30 = (ulong)(local_248 * 2);
    aiVar16 = *(_Type *)(pdVar4 + uVar30);
    aiVar17 = ((_Type *)(pdVar4 + uVar30))[1];
    local_318[0][0] = aiVar16[0];
    local_318[0][1] = aiVar16[1];
    local_318[1][0] = aiVar17[0];
    local_318[1][1] = aiVar17[1];
    local_318[2][0] = 0;
    local_318[2][1] = 0;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      dVar72 = local_3a8;
      aiVar23 = stack0xfffffffffffffc50;
      local_198._0_8_ = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_e8 = local_3a8;
    local_f8[0][0] = local_3b8._0_4_;
    local_f8[0][1] = local_3b8._4_4_;
    local_f8[1][0] = local_3b8._8_4_;
    local_f8[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      dVar68 = local_3a8;
      aiVar69 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_108 = local_3a8;
    local_118[0][0] = local_3b8._0_4_;
    local_118[0][1] = local_3b8._4_4_;
    local_118[1][0] = local_3b8._8_4_;
    local_118[1][1] = iStack_3ac;
    lVar35 = *(long *)(*(long *)(*(long *)&pPVar36->field_0x10 + (long)*(int *)(pPVar36 + 1) * 8) +
                      0x30);
    uVar1 = *(undefined8 *)(lVar35 + (long)(int)local_250 * 0xc);
    local_2b8[0] = (double)(float)uVar1;
    local_2b8[1] = (double)(float)((ulong)uVar1 >> 0x20);
    local_2b8[2] = (double)*(float *)(lVar35 + 8 + (long)(int)local_250 * 0xc);
    uVar1 = *(undefined8 *)(lVar35 + (long)local_250._4_4_ * 0xc);
    local_2d8[0] = (double)(float)uVar1;
    local_2d8[1] = (double)(float)((ulong)uVar1 >> 0x20);
    local_2d8[2] = (double)*(float *)(lVar35 + 8 + (long)local_250._4_4_ * 0xc);
    uVar1 = *(undefined8 *)(lVar35 + (long)local_248 * 0xc);
    local_2f8[0] = (double)(float)uVar1;
    local_2f8[1] = (double)(float)((ulong)uVar1 >> 0x20);
    local_2f8[2] = (double)*(float *)(lVar35 + 8 + (long)local_248 * 0xc);
    local_3a8 = local_2d8[2];
    local_3b8._0_8_ = local_2d8[0];
    stack0xfffffffffffffc50 = (_Type)local_2d8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      local_1b8._0_8_ = local_3a8;
      local_1e8._0_8_ = stack0xfffffffffffffc50;
      local_1a8._0_8_ = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_138[2] = local_3a8;
    local_138[0] = (double)local_3b8._0_8_;
    local_138[1] = (double)stack0xfffffffffffffc50;
    local_3a8 = local_2f8[2];
    local_3b8._0_8_ = local_2f8[0];
    stack0xfffffffffffffc50 = (_Type)local_2f8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      auVar63._8_8_ = local_3a8;
      auVar76._8_8_ = (double)stack0xfffffffffffffc50;
      uVar1 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_158[2] = local_3a8;
    local_158[0] = (double)local_3b8._0_8_;
    local_158[1] = (double)stack0xfffffffffffffc50;
    dVar51 = (double)aiVar23 * dVar68 - (double)aiVar69 * dVar72;
    dVar56 = dVar72 * (double)uVar21 - dVar68 * (double)local_198._0_8_;
    dVar53 = (double)local_198._0_8_ * (double)aiVar69 - (double)uVar21 * (double)aiVar23;
    dVar56 = SQRT(dVar53 * dVar53 + dVar56 * dVar56 + dVar51 * dVar51) * 0.5;
    if ((dVar56 == 0.0) && (!NAN(dVar56))) goto LAB_0013c997;
    dVar51 = (double)local_1e8._0_8_ * local_3a8 -
             (double)stack0xfffffffffffffc50 * (double)local_1b8._0_8_;
    local_1c8 = local_3a8;
    dVar53 = (double)local_1b8._0_8_ * (double)local_3b8._0_8_ - local_3a8 * (double)local_1a8._0_8_
    ;
    local_1d8 = (double)stack0xfffffffffffffc50;
    dVar61 = (double)local_1a8._0_8_ * (double)stack0xfffffffffffffc50 -
             (double)local_3b8._0_8_ * (double)local_1e8._0_8_;
    local_3a8 = local_2d8[2];
    local_3b8._0_8_ = local_2d8[0];
    stack0xfffffffffffffc50 = (_Type)local_2d8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_368 = local_3a8;
    local_378[1] = stack0xfffffffffffffc50;
    local_3a8 = local_2f8[2];
    local_3b8._0_8_ = local_2f8[0];
    stack0xfffffffffffffc50 = (_Type)local_2f8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1] = stack0xfffffffffffffc50;
    dVar10 = (double)uVar22 * (double)local_3b8._0_8_;
    lVar35 = 8;
    do {
      dVar10 = dVar10 + *(double *)((long)local_378[0] + lVar35) *
                        *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_3a8 = local_2d8[2];
    local_3b8._0_8_ = local_2d8[0];
    stack0xfffffffffffffc50 = (_Type)local_2d8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      dVar75 = local_3a8;
      dVar52 = (double)stack0xfffffffffffffc50;
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = local_2f8[2];
    local_3b8._0_8_ = local_2f8[0];
    stack0xfffffffffffffc50 = (_Type)local_2f8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2b8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar62 = dVar52 * local_3a8 - (double)stack0xfffffffffffffc50 * dVar75;
    dVar75 = dVar75 * (double)local_3b8._0_8_ - local_3a8 * (double)uVar22;
    dVar52 = (double)uVar22 * (double)stack0xfffffffffffffc50 - (double)local_3b8._0_8_ * dVar52;
    local_178._0_8_ = SQRT(dVar52 * dVar52 + dVar75 * dVar75 + dVar62 * dVar62);
    local_3a8 = local_2f8[2];
    local_3b8._0_8_ = local_2f8[0];
    stack0xfffffffffffffc50 = (_Type)local_2f8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2d8[lVar35];
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_188 = SQRT(dVar61 * dVar61 + dVar53 * dVar53 + dVar51 * dVar51) * 0.5;
    local_368 = local_3a8;
    local_378[1] = stack0xfffffffffffffc50;
    local_3a8 = local_2b8[2];
    local_3b8._0_8_ = local_2b8[0];
    stack0xfffffffffffffc50 = (_Type)local_2b8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2d8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1] = stack0xfffffffffffffc50;
    dVar53 = (double)uVar22 * (double)local_3b8._0_8_;
    lVar35 = 8;
    do {
      dVar53 = dVar53 + *(double *)((long)local_378[0] + lVar35) *
                        *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_3a8 = local_2f8[2];
    local_3b8._0_8_ = local_2f8[0];
    stack0xfffffffffffffc50 = (_Type)local_2f8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2d8[lVar35];
      dVar61 = local_3a8;
      dVar51 = (double)stack0xfffffffffffffc50;
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = local_2b8[2];
    local_3b8._0_8_ = local_2b8[0];
    stack0xfffffffffffffc50 = (_Type)local_2b8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2d8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar52 = dVar51 * local_3a8 - (double)stack0xfffffffffffffc50 * dVar61;
    dVar61 = dVar61 * (double)local_3b8._0_8_ - local_3a8 * (double)uVar22;
    dVar51 = (double)uVar22 * (double)stack0xfffffffffffffc50 - (double)local_3b8._0_8_ * dVar51;
    local_168._0_8_ = SQRT(dVar51 * dVar51 + dVar61 * dVar61 + dVar52 * dVar52);
    local_3a8 = local_2d8[2];
    local_3b8._0_8_ = local_2d8[0];
    stack0xfffffffffffffc50 = (_Type)local_2d8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2f8[lVar35];
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar10 = dVar10 / (double)local_178._0_8_;
    local_368 = local_3a8;
    local_378[1] = stack0xfffffffffffffc50;
    local_3a8 = local_2b8[2];
    local_3b8._0_8_ = local_2b8[0];
    stack0xfffffffffffffc50 = (_Type)local_2b8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2f8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1] = stack0xfffffffffffffc50;
    dVar51 = (double)uVar22 * (double)local_3b8._0_8_;
    lVar35 = 8;
    do {
      dVar51 = dVar51 + *(double *)((long)local_378[0] + lVar35) *
                        *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_3a8 = local_2d8[2];
    local_3b8._0_8_ = local_2d8[0];
    stack0xfffffffffffffc50 = (_Type)local_2d8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2f8[lVar35];
      dVar52 = local_3a8;
      dVar61 = (double)stack0xfffffffffffffc50;
      uVar22 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = local_2b8[2];
    local_3b8._0_8_ = local_2b8[0];
    stack0xfffffffffffffc50 = (_Type)local_2b8[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) = *(double *)(local_3b8 + lVar35 * 8) - local_2f8[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar62 = dVar61 * local_3a8 - (double)stack0xfffffffffffffc50 * dVar52;
    dVar52 = dVar52 * (double)local_3b8._0_8_ - local_3a8 * (double)uVar22;
    dVar61 = (double)uVar22 * (double)stack0xfffffffffffffc50 - (double)local_3b8._0_8_ * dVar61;
    dVar72 = SQRT(dVar72 * dVar72 +
                  (double)aiVar23 * (double)aiVar23 +
                  (double)local_198._0_8_ * (double)local_198._0_8_);
    auVar63._8_8_ =
         SQRT(auVar63._8_8_ * auVar63._8_8_ +
              auVar76._8_8_ * auVar76._8_8_ + (double)uVar1 * (double)uVar1);
    auVar76._8_8_ = (double)uVar21 * (double)local_198._0_8_;
    dVar68 = SQRT(dVar68 * dVar68 +
                  (double)aiVar69 * (double)aiVar69 + (double)uVar21 * (double)uVar21);
    dVar75 = SQRT((double)local_1b8._0_8_ * (double)local_1b8._0_8_ +
                  (double)local_1e8._0_8_ * (double)local_1e8._0_8_ +
                  (double)local_1a8._0_8_ * (double)local_1a8._0_8_);
    lVar35 = 8;
    do {
      auVar76._8_8_ =
           auVar76._8_8_ +
           *(double *)((long)local_118[0] + lVar35) * *(double *)((long)local_f8[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    dVar53 = dVar53 / (double)local_168._0_8_;
    dVar11 = (local_188 * local_188) / (dVar56 * dVar56) + 1.0;
    dVar66 = (double)uVar1 * (double)local_1a8._0_8_;
    lVar35 = 8;
    do {
      dVar66 = dVar66 + *(double *)((long)local_158 + lVar35) *
                        *(double *)((long)local_138 + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(local_338 + lVar35 * 2);
      aiVar23 = stack0xfffffffffffffc50;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(local_338 + lVar35 * 2);
      aiVar69 = (_Type)local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar51 = dVar51 / SQRT(dVar61 * dVar61 + dVar52 * dVar52 + dVar62 * dVar62);
    dVar61 = -(double)aiVar23;
    local_378[1][0] = local_3b8._0_4_;
    local_378[1][1] = local_3b8._4_4_;
    local_368 = 0.0;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(local_338 + lVar35 * 2);
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    dVar52 = (double)local_3b8._0_8_ * dVar61;
    lVar35 = 8;
    do {
      dVar52 = dVar52 + *(double *)((long)local_378[0] + lVar35) *
                        *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    if (dVar52 < 0.0) {
      uVar48 = (undefined4)DAT_0019a800;
      uVar49 = DAT_0019a800._4_4_;
      aiVar69 = (_Type)((ulong)aiVar69 ^ (ulong)DAT_0019a800);
    }
    else {
      uVar48 = 0;
      uVar49 = 0x80000000;
    }
    dVar62 = (double)((ulong)(local_188 * local_188) ^ CONCAT44(uVar49,uVar48)) /
             (dVar56 * dVar56 * dVar56);
    dVar56 = (double)((ulong)dVar51 ^ CONCAT44(uVar49,uVar48));
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * dVar56;
      dVar25 = local_3a8;
      aiVar24 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_388 = local_3a8;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * dVar53;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_218[2] = (_Type)local_3a8;
    local_218[0][0] = local_3b8._0_4_;
    local_218[0][1] = local_3b8._4_4_;
    local_218[1][0] = local_3b8._8_4_;
    local_218[1][1] = iStack_3ac;
    local_3a8 = dVar25;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar24;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - (double)local_218[lVar35];
      dVar25 = local_3a8;
      aiVar24 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_368 = local_3a8;
    local_378[1][0] = local_3b8._8_4_;
    local_378[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * (dVar53 + dVar51);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_238[2] = (_Type)local_3a8;
    local_238[0][0] = local_3b8._0_4_;
    local_238[0][1] = local_3b8._4_4_;
    local_238[1][0] = local_3b8._8_4_;
    local_238[1][1] = iStack_3ac;
    local_3a8 = dVar25;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar24;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           (double)local_238[lVar35] + *(double *)(local_3b8 + lVar35 * 8);
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar68 = (auVar76._8_8_ * -2.0 * dVar66 +
             dVar68 * dVar68 * dVar75 * dVar75 + auVar63._8_8_ * auVar63._8_8_ * dVar72 * dVar72) /
             (local_188 * 4.0);
    dVar72 = (double)(puVar27 + iVar2)[1];
    puVar27[iVar2] =
         (double)puVar27[iVar2] +
         (double)(~-(ulong)(dVar52 < 0.0) & (ulong)dVar61 | (ulong)aiVar23 & -(ulong)(dVar52 < 0.0))
         * dVar62 * dVar68 + (double)local_3b8._0_8_ * dVar11;
    (puVar27 + iVar2)[1] =
         dVar72 + (double)aiVar69 * dVar62 * dVar68 + (double)stack0xfffffffffffffc50 * dVar11;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - (double)local_318[lVar35];
      aiVar23 = stack0xfffffffffffffc50;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - (double)local_318[lVar35];
      aiVar69 = (_Type)local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar72 = -(double)aiVar23;
    local_378[1][0] = local_3b8._0_4_;
    local_378[1][1] = local_3b8._4_4_;
    local_368 = 0.0;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    auVar76._8_8_ = (double)local_3b8._0_8_ * dVar72;
    lVar35 = 8;
    do {
      auVar76._8_8_ =
           auVar76._8_8_ +
           *(double *)((long)local_378[0] + lVar35) * *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    if (auVar76._8_8_ < 0.0) {
      aiVar69 = (_Type)((ulong)aiVar69 ^ 0x8000000000000000);
    }
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * dVar56;
      auVar63._8_8_ = local_3a8;
      aiVar24 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_388 = local_3a8;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * dVar10;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_218[2] = (_Type)local_3a8;
    local_218[0][0] = local_3b8._0_4_;
    local_218[0][1] = local_3b8._4_4_;
    local_218[1][0] = local_3b8._8_4_;
    local_218[1][1] = iStack_3ac;
    local_3a8 = auVar63._8_8_;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar24;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - (double)local_218[lVar35];
      auVar63._8_8_ = local_3a8;
      aiVar24 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_368 = local_3a8;
    local_378[1][0] = local_3b8._8_4_;
    local_378[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * (dVar51 + dVar10);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_238[2] = (_Type)local_3a8;
    local_238[0][0] = local_3b8._0_4_;
    local_238[0][1] = local_3b8._4_4_;
    local_238[1][0] = local_3b8._8_4_;
    local_238[1][1] = iStack_3ac;
    local_3a8 = auVar63._8_8_;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar24;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           (double)local_238[lVar35] + *(double *)(local_3b8 + lVar35 * 8);
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    auVar63._8_8_ =
         (double)(puVar27 + iVar3)[1] +
         (double)aiVar69 * dVar62 * dVar68 + (double)stack0xfffffffffffffc50 * dVar11;
    auVar71._8_4_ = SUB84(auVar63._8_8_,0);
    auVar71._0_8_ =
         (double)puVar27[iVar3] +
         (double)(~-(ulong)(auVar76._8_8_ < 0.0) & (ulong)dVar72 |
                 (ulong)aiVar23 & -(ulong)(auVar76._8_8_ < 0.0)) * dVar62 * dVar68 +
         (double)local_3b8._0_8_ * dVar11;
    auVar71._12_4_ = (int)((ulong)auVar63._8_8_ >> 0x20);
    *(undefined1 (*) [16])(puVar27 + iVar3) = auVar71;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      aiVar23 = stack0xfffffffffffffc50;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      aiVar69 = (_Type)local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    dVar72 = -(double)aiVar23;
    local_378[1][0] = local_3b8._0_4_;
    local_378[1][1] = local_3b8._4_4_;
    local_368 = 0.0;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - *(double *)(&local_358)[lVar35]._M_elems;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_388 = local_3a8;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    auVar76._8_8_ = (double)local_3b8._0_8_ * dVar72;
    lVar35 = 8;
    do {
      auVar76._8_8_ =
           auVar76._8_8_ +
           *(double *)((long)local_378[0] + lVar35) * *(double *)((long)local_398[0] + lVar35);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    if (auVar76._8_8_ < 0.0) {
      aiVar69 = (_Type)((ulong)aiVar69 ^ (ulong)DAT_0019a800);
    }
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar14[0];
    local_3b8._4_4_ = aiVar14[1];
    local_3b8._8_4_ = aiVar15[0];
    iStack_3ac = aiVar15[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) =
           *(double *)(local_3b8 + lVar35) * (double)((ulong)dVar10 ^ (ulong)DAT_0019a800);
      auVar63._8_8_ = local_3a8;
      aiVar14 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_388 = local_3a8;
    local_398[0][0] = local_3b8._0_4_;
    local_398[0][1] = local_3b8._4_4_;
    local_398[1][0] = local_3b8._8_4_;
    local_398[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar12[0];
    local_3b8._4_4_ = aiVar12[1];
    local_3b8._8_4_ = aiVar13[0];
    iStack_3ac = aiVar13[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * dVar53;
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_218[2] = (_Type)local_3a8;
    local_218[0][0] = local_3b8._0_4_;
    local_218[0][1] = local_3b8._4_4_;
    local_218[1][0] = local_3b8._8_4_;
    local_218[1][1] = iStack_3ac;
    local_3a8 = auVar63._8_8_;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar14;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           *(double *)(local_3b8 + lVar35 * 8) - (double)local_218[lVar35];
      auVar63._8_8_ = local_3a8;
      aiVar12 = stack0xfffffffffffffc50;
      uVar21 = local_3b8._0_8_;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    local_368 = local_3a8;
    local_378[0][0] = local_3b8._0_4_;
    local_378[0][1] = local_3b8._4_4_;
    local_378[1][0] = local_3b8._8_4_;
    local_378[1][1] = iStack_3ac;
    local_3a8 = 0.0;
    local_3b8._0_4_ = aiVar16[0];
    local_3b8._4_4_ = aiVar16[1];
    local_3b8._8_4_ = aiVar17[0];
    iStack_3ac = aiVar17[1];
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35) = *(double *)(local_3b8 + lVar35) * (dVar10 + dVar53);
      lVar35 = lVar35 + 8;
    } while (lVar35 != 0x18);
    local_238[2] = (_Type)local_3a8;
    local_238[0][0] = local_3b8._0_4_;
    local_238[0][1] = local_3b8._4_4_;
    local_238[1][0] = local_3b8._8_4_;
    local_238[1][1] = iStack_3ac;
    local_3a8 = auVar63._8_8_;
    local_3b8._0_8_ = uVar21;
    stack0xfffffffffffffc50 = aiVar12;
    lVar35 = 0;
    do {
      *(double *)(local_3b8 + lVar35 * 8) =
           (double)local_238[lVar35] + *(double *)(local_3b8 + lVar35 * 8);
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    auVar63._8_8_ =
         (double)(puVar27 + uVar30)[1] +
         dVar68 * dVar62 * (double)aiVar69 + dVar11 * (double)stack0xfffffffffffffc50;
    auVar65._8_4_ = SUB84(auVar63._8_8_,0);
    auVar65._0_8_ =
         (double)puVar27[uVar30] +
         dVar68 * dVar62 * (double)(~-(ulong)(auVar76._8_8_ < 0.0) & (ulong)dVar72 |
                                   (ulong)aiVar23 & -(ulong)(auVar76._8_8_ < 0.0)) +
         dVar11 * (double)local_3b8._0_8_;
    auVar65._12_4_ = (int)((ulong)auVar63._8_8_ >> 0x20);
    *(undefined1 (*) [16])(puVar27 + uVar30) = auVar65;
    local_288._8_4_ = iVar26 + 1;
    iVar26 = iVar26 + 1;
    if (local_288._12_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_288);
      uVar28 = local_288._0_8_;
      iVar26 = local_288._8_4_;
    }
    auVar18._8_4_ = iVar26;
    auVar18._0_8_ = uVar28;
  }
  _local_3b8 = OpenMesh::PolyConnectivity::edges_begin(pPVar36);
  auVar77 = OpenMesh::PolyConnectivity::edges_end(pPVar36);
  auVar20._8_8_ = local_e0;
  auVar20._0_8_ = local_d8;
  uVar37 = (ulong)stack0xfffffffffffffc50;
  bVar39 = local_3b8._0_8_ != auVar77._0_8_;
  uVar37 = uVar37 & 0xffffffff;
  bVar40 = local_3b8._8_4_ != auVar77._8_4_;
  uVar30 = CONCAT71(auVar77._9_7_,bVar40 || bVar39);
  uVar38 = local_298;
  if (bVar40 || bVar39) {
    local_c8._8_8_ = local_278;
    local_c8._0_8_ = local_278;
    do {
      iVar26 = (int)uVar37;
      local_338[0].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)iVar26;
      uVar30 = *(ulong *)&local_340->field_0xe0;
      lVar35 = ((long)(uVar37 << 0x21) >> 0x21) * 0x20;
      if ((*(int *)(uVar30 + lVar35) < 0) || (*(int *)(uVar30 + 0x10 + lVar35) < 0)) {
        iVar2 = *(int *)(uVar30 + lVar35 + 4);
        iVar3 = *(int *)(uVar30 + lVar35 + 0x14);
        pdVar4 = (local_290->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        auVar71 = *(undefined1 (*) [16])(pdVar4 + (long)iVar2 * 2);
        auVar65 = *(undefined1 (*) [16])(pdVar4 + (long)iVar3 * 2);
        auVar76._8_8_ = auVar65._0_8_;
        auVar63._8_8_ = auVar65._8_8_;
        dVar72 = auVar71._0_8_;
        uVar30 = (ulong)auVar76._8_8_ & -(ulong)(dVar72 < auVar76._8_8_);
        auVar41._0_8_ = ~-(ulong)(auVar76._8_8_ < dVar72) & (ulong)dVar72;
        auVar41._8_8_ = ~-(ulong)(dVar72 < auVar76._8_8_) & (ulong)dVar72;
        auVar42._8_4_ = (int)uVar30;
        auVar42._0_8_ = (ulong)auVar76._8_8_ & -(ulong)(auVar76._8_8_ < dVar72);
        auVar42._12_4_ = (int)(uVar30 >> 0x20);
        auVar42 = divpd(auVar41 | auVar42,local_c8);
        uVar50 = (uint)(auVar42._0_8_ + -1.0);
        local_240 = (uint)(auVar42._8_8_ + 1.0);
        dVar68 = auVar71._8_8_;
        uVar54 = auVar71._8_4_;
        uVar55 = auVar71._12_4_;
        uVar48 = auVar65._8_4_;
        uVar49 = auVar65._12_4_;
        if (dVar68 <= auVar63._8_8_) {
          uVar48 = uVar54;
          uVar49 = uVar55;
        }
        local_258 = (ulong)uVar50;
        uVar30 = (ulong)local_240;
        if ((int)uVar50 <= (int)local_240) {
          local_1f8 = (long)iVar2 * 2;
          local_1f0 = (long)iVar3 * 2;
          local_2fc = (uint)((double)CONCAT44(uVar49,uVar48) / local_278 + -1.0);
          uVar48 = auVar65._8_4_;
          uVar49 = auVar65._12_4_;
          if (auVar63._8_8_ <= dVar68) {
            uVar48 = uVar54;
            uVar49 = uVar55;
          }
          local_23c = (uint)((double)CONCAT44(uVar49,uVar48) / local_278 + 1.0);
          uVar30 = (ulong)local_23c;
          local_1b8._0_8_ = auVar76._8_8_ - dVar72;
          local_1b8._8_8_ = auVar63._8_8_ - dVar68;
          local_a8._0_8_ =
               (double)local_1b8._8_8_ * (double)local_1b8._8_8_ +
               (double)local_1b8._0_8_ * (double)local_1b8._0_8_;
          local_a8._8_8_ = local_1b8._8_8_;
          local_1d8 = SQRT(local_a8._0_8_);
          local_1e8._8_4_ = SUB84(dVar68 - auVar63._8_8_,0);
          local_1e8._0_8_ = dVar72 - auVar76._8_8_;
          local_1e8._12_4_ = (int)((ulong)(dVar68 - auVar63._8_8_) >> 0x20);
          uStack_1d0 = 0;
          auVar43._8_8_ = local_1d8;
          auVar43._0_8_ = local_1d8;
          local_b8 = divpd(local_1b8,auVar43);
          local_1a8._8_4_ = uVar54;
          local_1a8._0_8_ = dVar68 - auVar63._8_8_;
          local_1a8._12_4_ = uVar55;
          pPVar36 = local_340;
          local_1c8 = (double)local_1b8._8_8_;
          dStack_1c0 = (double)local_1b8._8_8_;
          local_198 = auVar65;
          local_168 = auVar71;
          do {
            uVar50 = local_2fc;
            if ((int)local_2fc <= (int)uVar30) {
              do {
                local_e0 = auVar77._8_8_;
                local_d8 = auVar77._0_8_;
                local_d0 = (ulong)uVar50;
                local_358._M_elems[1] = uVar50;
                local_358._M_elems[0] = (int)local_258;
                pVar78 = std::
                         _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         ::equal_range(&neighbors._M_h,(key_type *)&local_358);
                for (_Var29._M_cur =
                          (__node_type *)
                          pVar78.first.
                          super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                          ._M_cur; auVar77._8_8_ = local_e0, auVar77._0_8_ = local_d8,
                    (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                    _Var29._M_cur !=
                    pVar78.second.
                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ; _Var29._M_cur = (__node_type *)((_Var29._M_cur)->super__Hash_node_base)._M_nxt
                    ) {
                  iVar26 = *(int *)((long)&((_Var29._M_cur)->
                                           super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                           ._M_storage._M_storage + 8);
                  if ((iVar26 != iVar2) && (iVar26 != iVar3)) {
                    pdVar4 = (local_290->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data + (long)iVar26 * 2;
                    local_188 = *pdVar4;
                    dStack_180 = pdVar4[1];
                    local_358._M_elems[0] = iVar26;
                    dVar72 = getDistance((Mesh *)pPVar36,local_290,local_338,
                                         (VertexHandle *)&local_358);
                    if ((dVar72 == 0.0) && (uVar30 = extraout_RDX_00, !NAN(dVar72)))
                    goto LAB_0013c997;
                    dVar72 = local_278 / dVar72 + -1.0;
                    if (dVar72 <= 0.0) {
                      dVar72 = 0.0;
                    }
                    auVar57._8_8_ = uStack_270;
                    auVar57._0_8_ = dVar72;
                    if (((dVar72 != 0.0) || (NAN(dVar72))) &&
                       (iVar26 = *(int *)((long)&((_Var29._M_cur)->
                                                 super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                                 ).
                                                 super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                                 ._M_storage._M_storage + 8), iVar26 != -1)) {
                      auVar76._0_8_ = local_188 - (double)local_168._0_8_;
                      auVar76._8_8_ = dStack_180 - (double)local_168._8_8_;
                      uVar48 = (undefined4)((ulong)auVar76._8_8_ >> 0x20);
                      dVar68 = auVar76._8_8_ * local_1c8 + (double)local_1b8._0_8_ * auVar76._0_8_;
                      lVar35 = (long)iVar26;
                      auVar71 = *(undefined1 (*) [16])
                                 ((local_290->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                  m_storage.m_data + lVar35 * 2);
                      auVar63._0_8_ = auVar71._0_8_ - (double)local_168._0_8_;
                      auVar63._8_8_ = auVar71._8_8_ - (double)local_168._8_8_;
                      auVar73._8_8_ = auVar63._8_8_;
                      auVar73._0_8_ = auVar63._8_8_;
                      dVar56 = (auVar63._8_8_ * auVar63._8_8_ + auVar63._0_8_ * auVar63._0_8_) -
                               (dVar68 / local_1d8) * (dVar68 / local_1d8);
                      if (dVar56 < 0.0) {
                        local_88._8_4_ = SUB84(auVar76._8_8_,0);
                        local_88._0_8_ = auVar76._8_8_;
                        local_88._12_4_ = uVar48;
                        local_98._8_4_ = SUB84(auVar76._8_8_,0);
                        local_98._0_8_ = dVar68;
                        local_98._12_4_ = uVar48;
                        local_178 = auVar57;
                        local_78 = auVar76;
                        local_68 = auVar73;
                        local_58 = auVar71;
                        local_48 = auVar63;
                        dVar56 = sqrt(dVar56);
                        auVar65 = local_48;
                        auVar71 = local_58;
                        auVar77 = local_78;
                        dVar68 = (double)local_98._0_8_;
                        auVar76._8_8_ = (double)local_88._0_8_;
                        dVar72 = (double)local_178._0_8_;
                        auVar63._8_8_ = (double)local_68._0_8_;
                      }
                      else {
                        dVar56 = SQRT(dVar56);
                        auVar65 = auVar63;
                        auVar77 = auVar76;
                      }
                      auVar70._0_8_ = local_188 - (double)local_198._0_8_;
                      auVar70._8_8_ = dStack_180 - (double)local_198._8_8_;
                      if (0.0 <= auVar70._8_8_ * (double)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) +
                                 (double)local_1e8._0_8_ * auVar70._0_8_) {
                        if (dVar68 < 0.0) {
                          dVar68 = SQRT(auVar76._8_8_ * auVar76._8_8_ +
                                        auVar77._0_8_ * auVar77._0_8_);
                          auVar6._8_4_ = SUB84(dVar68,0);
                          auVar6._0_8_ = dVar68;
                          auVar6._12_4_ = (int)((ulong)dVar68 >> 0x20);
                          auVar71 = divpd(auVar77,auVar6);
                          dVar72 = dVar72 * -2.0 * local_278;
                          auVar45._0_8_ = dVar56 * dVar56;
                          auVar59._0_8_ = dVar72 * auVar71._0_8_;
                          auVar59._8_8_ = dVar72 * auVar71._8_8_;
                          auVar45._8_8_ = auVar45._0_8_;
                          auVar71 = divpd(auVar59,auVar45);
                          lVar34 = local_1f8;
                          goto LAB_0013c807;
                        }
                        auVar76._8_8_ =
                             (auVar63._8_8_ * local_1c8 + (double)local_1b8._0_8_ * auVar65._0_8_) /
                             local_1d8;
                        auVar64._0_8_ = auVar65._0_8_ - auVar76._8_8_ * (double)local_b8._0_8_;
                        auVar64._8_8_ = auVar65._8_8_ - auVar76._8_8_ * (double)local_b8._8_8_;
                        dVar68 = SQRT(auVar64._8_8_ * auVar64._8_8_ + auVar64._0_8_ * auVar64._0_8_)
                        ;
                        auVar7._8_4_ = SUB84(dVar68,0);
                        auVar7._0_8_ = dVar68;
                        auVar7._12_4_ = (int)((ulong)dVar68 >> 0x20);
                        auVar65 = divpd(auVar64,auVar7);
                        dVar68 = dVar72 * -2.0 * local_278;
                        dVar72 = (auVar76._8_8_ * dVar68) / local_a8._0_8_;
                        auVar76._8_8_ = auVar65._0_8_;
                        auVar74._0_8_ = dVar72 * auVar76._8_8_;
                        auVar63._8_8_ = auVar65._8_8_;
                        auVar74._8_8_ = dVar72 * auVar63._8_8_;
                        auVar46._0_8_ = dVar56 * dVar56;
                        auVar46._8_8_ = auVar46._0_8_;
                        auVar65 = divpd(auVar74,auVar46);
                        dVar72 = (double)(puVar27 + local_1f0)[1] + auVar65._8_8_;
                        auVar8._8_4_ = SUB84(dVar72,0);
                        auVar8._0_8_ = (double)puVar27[local_1f0] + auVar65._0_8_;
                        auVar8._12_4_ = (int)((ulong)dVar72 >> 0x20);
                        *(undefined1 (*) [16])(puVar27 + local_1f0) = auVar8;
                        dVar72 = ((((auVar71._8_8_ - (double)local_198._8_8_) *
                                    (double)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) +
                                   (double)local_1e8._0_8_ *
                                   (auVar71._0_8_ - (double)local_198._0_8_)) / local_1d8) * dVar68)
                                 / local_a8._0_8_;
                        auVar67._0_8_ = dVar72 * auVar76._8_8_;
                        auVar67._8_8_ = dVar72 * auVar63._8_8_;
                        auVar71 = divpd(auVar67,auVar46);
                        dVar72 = (double)(puVar27 + local_1f8)[1] + auVar71._8_8_;
                        auVar9._8_4_ = SUB84(dVar72,0);
                        auVar9._0_8_ = (double)puVar27[local_1f8] + auVar71._0_8_;
                        auVar9._12_4_ = (int)((ulong)dVar72 >> 0x20);
                        *(undefined1 (*) [16])(puVar27 + local_1f8) = auVar9;
                        auVar60._0_8_ = dVar68 * auVar76._8_8_;
                        auVar60._8_8_ = dVar68 * auVar63._8_8_;
                        auVar71 = divpd(auVar60,auVar46);
                      }
                      else {
                        dVar68 = SQRT(auVar70._8_8_ * auVar70._8_8_ + auVar70._0_8_ * auVar70._0_8_)
                        ;
                        auVar5._8_4_ = SUB84(dVar68,0);
                        auVar5._0_8_ = dVar68;
                        auVar5._12_4_ = (int)((ulong)dVar68 >> 0x20);
                        auVar71 = divpd(auVar70,auVar5);
                        dVar72 = dVar72 * -2.0 * local_278;
                        auVar44._0_8_ = dVar56 * dVar56;
                        auVar58._0_8_ = dVar72 * auVar71._0_8_;
                        auVar58._8_8_ = dVar72 * auVar71._8_8_;
                        auVar44._8_8_ = auVar44._0_8_;
                        auVar71 = divpd(auVar58,auVar44);
                        lVar34 = local_1f0;
LAB_0013c807:
                        dVar72 = (double)(puVar27 + lVar34)[1];
                        puVar27[lVar34] = (double)puVar27[lVar34] - auVar71._0_8_;
                        (puVar27 + lVar34)[1] = dVar72 - auVar71._8_8_;
                      }
                      auVar47._0_8_ = (double)puVar27[lVar35 * 2] + auVar71._0_8_;
                      auVar47._8_8_ = (double)(puVar27 + lVar35 * 2)[1] + auVar71._8_8_;
                      *(undefined1 (*) [16])(puVar27 + lVar35 * 2) = auVar47;
                      pPVar36 = local_340;
                    }
                  }
                }
                uVar30 = (ulong)local_23c;
                uVar50 = (uint)local_d0 + 1;
              } while ((uint)local_d0 != local_23c);
            }
            uVar50 = (uint)local_258;
            local_258 = (ulong)(uVar50 + 1);
          } while (uVar50 != local_240);
          iVar26 = local_3b8._8_4_;
          uVar38 = local_298;
          auVar20 = auVar77;
        }
      }
      local_e0 = auVar20._8_8_;
      local_d8 = auVar20._0_8_;
      stack0xfffffffffffffc50 = (_Type)CONCAT44(iStack_3ac,iVar26 + 1U);
      uVar50 = iVar26 + 1U;
      if (iStack_3ac != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_3b8);
        auVar20._8_8_ = local_e0;
        auVar20._0_8_ = local_d8;
        uVar30 = extraout_RDX;
        uVar50 = local_3b8._8_4_;
      }
      auVar19._8_8_ = stack0xfffffffffffffc50;
      auVar19._0_8_ = local_3b8._0_8_;
      uVar37 = (ulong)uVar50;
    } while ((local_3b8._0_8_ != auVar77._0_8_) || (_local_3b8 = auVar19, uVar50 != auVar77._8_4_));
  }
  *(undefined8 **)
   &(local_260->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity = puVar27;
  *(ulong *)&(local_260->super_Mesh).
             super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             .super_PolyConnectivity.field_0x8 = uVar38;
  goto LAB_0013c9cc;
LAB_0013c997:
  *puVar27 = 0x7ff0000000000000;
  *(undefined8 **)
   &(local_260->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity = puVar27;
  *(ulong *)&(local_260->super_Mesh).
             super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             .super_PolyConnectivity.field_0x8 = local_298;
LAB_0013c9cc:
  tVar79.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar30;
  tVar79.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_260;
  return (type)tVar79.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto calcGrad(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    // update the hashmap for computing the energy and gradient
    initHashMap(mesh, x, epsilon);
    // the energy term
    Eigen::VectorXd gradx(x.size());
    gradx.setZero();
    // the gradient for distortion term
    for (auto f: mesh.all_faces()) {
        Mesh::VertexHandle vs[3];
        int i = 0;
        for (auto itr = mesh.cfv_ccwbegin(f); itr != mesh.cfv_ccwend(f); itr++)
            vs[i++] = *itr;
        OpenMesh::Vec3d u0(x[2 * vs[0].idx()], x[2 * vs[0].idx() + 1], 0.0);
        OpenMesh::Vec3d u1(x[2 * vs[1].idx()], x[2 * vs[1].idx() + 1], 0.0);
        OpenMesh::Vec3d u2(x[2 * vs[2].idx()], x[2 * vs[2].idx() + 1], 0.0);
        OpenMesh::Vec3d ue1 = u1 - u0;
        OpenMesh::Vec3d ue2 = u2 - u0;

        OpenMesh::Vec3d p0(mesh.point(vs[0])[0], mesh.point(vs[0])[1], mesh.point(vs[0])[2]);
        OpenMesh::Vec3d p1(mesh.point(vs[1])[0], mesh.point(vs[1])[1], mesh.point(vs[1])[2]);
        OpenMesh::Vec3d p2(mesh.point(vs[2])[0], mesh.point(vs[2])[1], mesh.point(vs[2])[2]);
        OpenMesh::Vec3d pe1 = p1 - p0;
        OpenMesh::Vec3d pe2 = p2 - p0;

        // calculate the area of corresponding triangle
        double su = 0.5 * OpenMesh::cross(ue1, ue2).norm();
        if (su == 0.0) {
            gradx[0] = std::numeric_limits<double>::infinity();
            return std::move(gradx);
        }
        double sp = 0.5 * OpenMesh::cross(pe1, pe2).norm();

        double cot0 = OpenMesh::dot(p1 - p0, p2 - p0) / OpenMesh::cross(p1 - p0, p2 - p0).norm();
        double cot1 = OpenMesh::dot(p2 - p1, p0 - p1) / OpenMesh::cross(p2 - p1, p0 - p1).norm();
        double cot2 = OpenMesh::dot(p1 - p2, p0 - p2) / OpenMesh::cross(p1 - p2, p0 - p2).norm();
        
        double term1 = (1 + (sp * sp) / (su * su));
        double term2 = (sq(ue2.norm()) * sq(pe1.norm()) + sq(ue1.norm()) * sq(pe2.norm()) - 2.0f * dot(ue2, ue1) * dot(pe2, pe1)) / (4.0f * sp);

        {
            // dE / du0
            OpenMesh::Vec2d height(-(u2 - u1)[1], (u2 - u1)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u0 - u1) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du0 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du0 = -cot2 * u1 - cot1 * u2 + (cot1 + cot2) * u0;
            OpenMesh::Vec2d dE_du0 = dterm1_du0 * term2 + OpenMesh::Vec2d(dterm2_du0[0], dterm2_du0[1]) * term1; 
            gradx[vs[0].idx() * 2] += dE_du0[0];
            gradx[vs[0].idx() * 2 + 1] += dE_du0[1];
        }

        {
            // dE / du1
            OpenMesh::Vec2d height(-(u0 - u2)[1], (u0 - u2)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u1 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du1 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du1 = -cot2 * u0 - cot0 * u2 + (cot0 + cot2) * u1;
            OpenMesh::Vec2d dE_du1 = dterm1_du1 * term2 + OpenMesh::Vec2d(dterm2_du1[0], dterm2_du1[1]) * term1; 
            gradx[vs[1].idx() * 2] += dE_du1[0];
            gradx[vs[1].idx() * 2 + 1] += dE_du1[1];
        }

        {
            // dE / du2
            OpenMesh::Vec2d height(-(u1 - u0)[1], (u1 - u0)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u2 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du2 = -(sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du2 = -cot0 * u1 - cot1 * u0 + (cot0 + cot1) * u2;
            OpenMesh::Vec2d dE_du2 = dterm1_du2 * term2 + OpenMesh::Vec2d(dterm2_du2[0], dterm2_du2[1]) * term1; 
            gradx[vs[2].idx() * 2] += dE_du2[0];
            gradx[vs[2].idx() * 2 + 1] += dE_du2[1];
        }
    }

    int cnt = 0;
    // the singularity term
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            double seng = 0.0;
            int ui_idx = -1;

            int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            OpenMesh::Vec2d pst(x[2 * st], x[2 * st + 1]);
            OpenMesh::Vec2d pend(x[2 * end], x[2 * end + 1]);
            OpenMesh::Vec2d edge = pend - pst;

            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            OpenMesh::Vec2d point(x[itr->second * 2], x[itr->second * 2 + 1]);
                            double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));

                            if (dis == 0.0) {
                                gradx[0] = std::numeric_limits<double>::infinity();
                                return std::move(gradx);
                            }
                            seng = std::max(0.0, epsilon / dis - 1.0);
                            // calculate the gradient
                            ui_idx = itr->second;
                            if (ui_idx != -1 && seng != 0.0) {
                                OpenMesh::Vec2d grad_maxui;
                                OpenMesh::Vec2d grad_maxu1;
                                OpenMesh::Vec2d grad_maxu2;
                                OpenMesh::Vec2d ui(x[ui_idx * 2], x[ui_idx * 2 + 1]);
                                auto u1 = pst;
                                auto u2 = pend;
                                double dis = sqrt(OpenMesh::dot(ui - u1, ui - u1) - projected * projected);
                                
                                if (OpenMesh::dot(point - pend, pst - pend) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pend).normalize();
                                    OpenMesh::Vec2d dir_u2 = -(point - pend).normalize();
                                    
                                    // dE / du2
                                    gradx[end * 2] += -2.0 * seng * epsilon * dir_u2[0] / (dis * dis);
                                    gradx[end * 2 + 1] +=  -2.0 * seng * epsilon * dir_u2[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);
                                }
                                else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pst).normalize();
                                    OpenMesh::Vec2d dir_u1 = -(point - pst).normalize();

                                    // dE / du1
                                    gradx[st * 2] += -2.0 * seng * epsilon * dir_u1[0] / (dis * dis);
                                    gradx[st * 2 + 1] +=  -2.0 * seng * epsilon * dir_u1[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);

                                }
                                else {
                                    double projected = OpenMesh::dot(ui - u1, u2 - u1) / edge.norm();
                                    // the unit vector othorgonal to the edge
                                    auto normal = ui - u1 - (u2 - u1).normalize() * projected;
                                    normal = normal.normalize();
                                    // dE / du2 u2 is the end point of this edge
                                    grad_maxu2 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[end * 2] += grad_maxu2[0];
                                    gradx[end * 2 + 1] += grad_maxu2[1];
                                    // dE / du1 u1 is the start point of this edge
                                    projected = OpenMesh::dot(ui - u2, u1 - u2) / edge.norm();
                                    grad_maxu1 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[st * 2] += grad_maxu1[0];
                                    gradx[st * 2 + 1] += grad_maxu1[1];
                                    // dE / dui ui is the point with maximal distance
                                    grad_maxui = -2 * seng * epsilon * normal / (dis * dis);
                                    gradx[ui_idx * 2] += grad_maxui[0];
                                    gradx[ui_idx * 2 + 1] += grad_maxui[1];
                                }
                            }
                        }
                }
        }
    return std::move(gradx);
}